

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O1

void __thiscall
llvm::raw_ostream::SetBufferAndMode(raw_ostream *this,char *BufferStart,size_t Size,BufferKind Mode)

{
  char *pcVar1;
  bool bVar2;
  
  bVar2 = Size != 0 && BufferStart != (char *)0x0;
  if (Mode == Unbuffered) {
    bVar2 = BufferStart == (char *)0x0 && Size == 0;
  }
  if (!bVar2) {
    __assert_fail("((Mode == BufferKind::Unbuffered && !BufferStart && Size == 0) || (Mode != BufferKind::Unbuffered && BufferStart && Size != 0)) && \"stream must be unbuffered or have at least one byte\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/raw_ostream.cpp"
                  ,0x6e,"void llvm::raw_ostream::SetBufferAndMode(char *, size_t, BufferKind)");
  }
  pcVar1 = this->OutBufStart;
  if (this->OutBufCur != pcVar1) {
    __assert_fail("GetNumBytesInBuffer() == 0 && \"Current buffer is non-empty!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/raw_ostream.cpp"
                  ,0x71,"void llvm::raw_ostream::SetBufferAndMode(char *, size_t, BufferKind)");
  }
  if ((pcVar1 != (char *)0x0) && (this->BufferMode == InternalBuffer)) {
    operator_delete__(pcVar1);
  }
  this->OutBufStart = BufferStart;
  this->OutBufEnd = BufferStart + Size;
  this->OutBufCur = BufferStart;
  this->BufferMode = Mode;
  if (-1 < (long)Size) {
    return;
  }
  __assert_fail("OutBufStart <= OutBufEnd && \"Invalid size!\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/raw_ostream.cpp"
                ,0x7a,"void llvm::raw_ostream::SetBufferAndMode(char *, size_t, BufferKind)");
}

Assistant:

void raw_ostream::SetBufferAndMode(char *BufferStart, size_t Size,
                                   BufferKind Mode) {
  assert(((Mode == BufferKind::Unbuffered && !BufferStart && Size == 0) ||
          (Mode != BufferKind::Unbuffered && BufferStart && Size != 0)) &&
         "stream must be unbuffered or have at least one byte");
  // Make sure the current buffer is free of content (we can't flush here; the
  // child buffer management logic will be in write_impl).
  assert(GetNumBytesInBuffer() == 0 && "Current buffer is non-empty!");

  if (BufferMode == BufferKind::InternalBuffer)
    delete [] OutBufStart;
  OutBufStart = BufferStart;
  OutBufEnd = OutBufStart+Size;
  OutBufCur = OutBufStart;
  BufferMode = Mode;

  assert(OutBufStart <= OutBufEnd && "Invalid size!");
}